

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MakeVerboseFormat.cpp
# Opt level: O2

bool __thiscall
Assimp::MakeVerboseFormatProcess::MakeVerboseFormat(MakeVerboseFormatProcess *this,aiMesh *pcMesh)

{
  aiColor4D *paVar1;
  uint uVar2;
  uint uVar3;
  aiVector3D *paVar4;
  uint uVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  ulong *puVar9;
  bool bVar10;
  aiVector3D *paVar11;
  aiColor4D *paVar12;
  aiVertexWeight *paVar13;
  uint *puVar14;
  uint a;
  vector<aiVertexWeight,_std::allocator<aiVertexWeight>_> *__s;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  aiFace *paVar18;
  ulong *puVar19;
  uint uVar20;
  uint i_1;
  ulong uVar21;
  vector<aiVertexWeight,_std::allocator<aiVertexWeight>_> *this_00;
  uint i;
  ulong uVar22;
  aiVector3D *local_108;
  aiVector3D *local_100;
  aiVector3D *local_f8;
  value_type local_e8;
  ulong *local_e0;
  aiVector3D *local_d8;
  ulong local_d0;
  ulong local_c8;
  vector<aiVertexWeight,_std::allocator<aiVertexWeight>_> *local_c0;
  aiColor4D *apvColorSets [8];
  aiVector3D *apvTextureCoords [8];
  
  if (pcMesh == (aiMesh *)0x0) {
    __assert_fail("__null != pcMesh",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/PostProcessing/MakeVerboseFormat.cpp"
                  ,0x59,"bool Assimp::MakeVerboseFormatProcess::MakeVerboseFormat(aiMesh *)");
  }
  uVar2 = pcMesh->mNumVertices;
  uVar20 = pcMesh->mNumFaces;
  uVar5 = uVar20 * 3;
  uVar22 = (ulong)uVar5 * 0xc;
  paVar11 = (aiVector3D *)operator_new__(uVar22);
  if (uVar20 != 0) {
    memset(paVar11,0,((uVar22 - 0xc) - (uVar22 - 0xc) % 0xc) + 0xc);
  }
  if (uVar2 == 0 || pcMesh->mNormals == (aiVector3D *)0x0) {
    local_100 = (aiVector3D *)0x0;
  }
  else {
    local_100 = (aiVector3D *)operator_new__(uVar22);
    if (uVar20 != 0) {
      memset(local_100,0,((uVar22 - 0xc) - (uVar22 - 0xc) % 0xc) + 0xc);
    }
  }
  local_d8 = paVar11;
  bVar10 = aiMesh::HasTangentsAndBitangents(pcMesh);
  if (bVar10) {
    local_f8 = (aiVector3D *)operator_new__(uVar22);
    if (uVar20 != 0) {
      memset(local_f8,0,((uVar22 - 0xc) - (uVar22 - 0xc) % 0xc) + 0xc);
    }
    local_108 = (aiVector3D *)operator_new__(uVar22);
    if (uVar20 != 0) {
      memset(local_108,0,((uVar22 - 0xc) - (uVar22 - 0xc) % 0xc) + 0xc);
    }
  }
  else {
    local_108 = (aiVector3D *)0x0;
    local_f8 = (aiVector3D *)0x0;
  }
  apvTextureCoords[6] = (aiVector3D *)0x0;
  apvTextureCoords[7] = (aiVector3D *)0x0;
  apvTextureCoords[4] = (aiVector3D *)0x0;
  apvTextureCoords[5] = (aiVector3D *)0x0;
  apvTextureCoords[2] = (aiVector3D *)0x0;
  apvTextureCoords[3] = (aiVector3D *)0x0;
  apvTextureCoords[0] = (aiVector3D *)0x0;
  apvTextureCoords[1] = (aiVector3D *)0x0;
  apvColorSets[6] = (aiColor4D *)0x0;
  apvColorSets[7] = (aiColor4D *)0x0;
  apvColorSets[4] = (aiColor4D *)0x0;
  apvColorSets[5] = (aiColor4D *)0x0;
  apvColorSets[2] = (aiColor4D *)0x0;
  apvColorSets[3] = (aiColor4D *)0x0;
  apvColorSets[0] = (aiColor4D *)0x0;
  apvColorSets[1] = (aiColor4D *)0x0;
  lVar17 = 0;
  while (((lVar17 != 8 && (pcMesh->mTextureCoords[lVar17] != (aiVector3D *)0x0)) &&
         (pcMesh->mNumVertices != 0))) {
    paVar11 = (aiVector3D *)operator_new__(uVar22);
    if (uVar20 != 0) {
      memset(paVar11,0,((uVar22 - 0xc) - (uVar22 - 0xc) % 0xc) + 0xc);
    }
    apvTextureCoords[lVar17] = paVar11;
    lVar17 = lVar17 + 1;
  }
  uVar22 = (ulong)uVar5 << 4;
  lVar17 = 0;
  while (((lVar17 != 8 && (pcMesh->mColors[lVar17] != (aiColor4D *)0x0)) &&
         (pcMesh->mNumVertices != 0))) {
    paVar12 = (aiColor4D *)operator_new__(uVar22);
    if (uVar20 != 0) {
      memset(paVar12,0,uVar22);
    }
    apvColorSets[lVar17] = paVar12;
    lVar17 = lVar17 + 1;
  }
  uVar3 = pcMesh->mNumBones;
  uVar22 = (ulong)uVar3;
  local_e0 = (ulong *)operator_new__(uVar22 * 0x18 + 8);
  *local_e0 = uVar22;
  __s = (vector<aiVertexWeight,_std::allocator<aiVertexWeight>_> *)(local_e0 + 1);
  if (uVar3 != 0) {
    uVar21 = uVar22 * 0x18 - 0x18;
    memset(__s,0,(uVar21 - uVar21 % 0x18) + 0x18);
  }
  this_00 = __s;
  for (uVar21 = 0; uVar21 < uVar22; uVar21 = uVar21 + 1) {
    std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::reserve
              (this_00,(ulong)(pcMesh->mBones[uVar21]->mNumWeights * 3));
    uVar22 = (ulong)pcMesh->mNumBones;
    this_00 = this_00 + 1;
  }
  uVar22 = 0;
  uVar21 = 0;
  local_d0 = (ulong)uVar20;
  local_c0 = __s;
  do {
    if (pcMesh->mNumFaces <= uVar22) {
      puVar19 = local_e0 + 2;
      for (uVar22 = 0; puVar9 = local_e0, uVar22 < pcMesh->mNumBones; uVar22 = uVar22 + 1) {
        paVar13 = pcMesh->mBones[uVar22]->mWeights;
        if (paVar13 != (aiVertexWeight *)0x0) {
          operator_delete__(paVar13);
        }
        if (puVar19[-1] == *puVar19) {
          pcMesh->mBones[uVar22]->mWeights = (aiVertexWeight *)0x0;
        }
        else {
          uVar16 = *puVar19 - puVar19[-1];
          uVar21 = 0xffffffffffffffff;
          if (-1 < (long)uVar16) {
            uVar21 = uVar16;
          }
          paVar13 = (aiVertexWeight *)operator_new__(uVar21);
          memset(paVar13,0,(uVar16 - 8 & 0xfffffffffffffff8) + 8);
          pcMesh->mBones[uVar22]->mWeights = paVar13;
          memcpy(pcMesh->mBones[uVar22]->mWeights,(void *)puVar19[-1],*puVar19 - (long)puVar19[-1]);
        }
        puVar19 = puVar19 + 3;
      }
      if (*local_e0 != 0) {
        lVar17 = *local_e0 * 0x18;
        do {
          std::_Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>::~_Vector_base
                    ((_Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_> *)
                     ((long)puVar9 + lVar17 + -0x10));
          lVar17 = lVar17 + -0x18;
        } while (lVar17 != 0);
      }
      operator_delete__(puVar9);
      uVar22 = local_d0;
      paVar11 = local_d8;
      if (pcMesh->mVertices != (aiVector3D *)0x0) {
        operator_delete__(pcMesh->mVertices);
      }
      pcMesh->mVertices = paVar11;
      lVar17 = 0xe;
      while (((lVar17 != 0x16 && (pcMesh->mColors[lVar17 + -6] != (aiColor4D *)0x0)) &&
             (pcMesh->mNumVertices != 0))) {
        operator_delete__(pcMesh->mColors[lVar17 + -6]);
        *(value_type *)(pcMesh->mColors + lVar17 + -6) = (&local_e8)[lVar17];
        lVar17 = lVar17 + 1;
      }
      lVar17 = 6;
      while (((lVar17 != 0xe && (pcMesh->mColors[lVar17 + -6] != (aiColor4D *)0x0)) &&
             (pcMesh->mNumVertices != 0))) {
        operator_delete__(pcMesh->mColors[lVar17 + -6]);
        *(value_type *)(pcMesh->mColors + lVar17 + -6) = (&local_e8)[lVar17];
        lVar17 = lVar17 + 1;
      }
      pcMesh->mNumVertices = uVar5;
      if ((int)uVar22 != 0 && pcMesh->mNormals != (aiVector3D *)0x0) {
        operator_delete__(pcMesh->mNormals);
        pcMesh->mNormals = local_100;
      }
      bVar10 = aiMesh::HasTangentsAndBitangents(pcMesh);
      if (bVar10) {
        if (pcMesh->mTangents != (aiVector3D *)0x0) {
          operator_delete__(pcMesh->mTangents);
        }
        pcMesh->mTangents = local_f8;
        if (pcMesh->mBitangents != (aiVector3D *)0x0) {
          operator_delete__(pcMesh->mBitangents);
        }
        pcMesh->mBitangents = local_108;
      }
      return pcMesh->mNumVertices != uVar2;
    }
    paVar18 = pcMesh->mFaces + uVar22;
    local_c8 = uVar22;
    for (uVar16 = 0; uVar16 < paVar18->mNumIndices; uVar16 = uVar16 + 1) {
      for (uVar22 = 0; uVar20 = (uint)uVar21, uVar22 < pcMesh->mNumBones; uVar22 = uVar22 + 1) {
        for (uVar15 = 0; uVar15 < pcMesh->mBones[uVar22]->mNumWeights; uVar15 = uVar15 + 1) {
          paVar13 = pcMesh->mBones[uVar22]->mWeights;
          if (paVar18->mIndices[uVar16] == paVar13[uVar15].mVertexId) {
            local_e8.mWeight = paVar13[uVar15].mWeight;
            local_e8.mVertexId = uVar20;
            std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::push_back
                      (__s + uVar22,&local_e8);
          }
        }
        __s = local_c0;
      }
      paVar11 = pcMesh->mVertices;
      uVar3 = paVar18->mIndices[uVar16];
      local_d8[uVar21].z = paVar11[uVar3].z;
      paVar11 = paVar11 + uVar3;
      fVar6 = paVar11->y;
      local_d8[uVar21].x = paVar11->x;
      local_d8[uVar21].y = fVar6;
      paVar11 = pcMesh->mNormals;
      if ((paVar11 != (aiVector3D *)0x0) && (pcMesh->mNumVertices != 0)) {
        local_100[uVar21].z = paVar11[uVar3].z;
        fVar6 = paVar11[uVar3].y;
        local_100[uVar21].x = paVar11[uVar3].x;
        local_100[uVar21].y = fVar6;
      }
      bVar10 = aiMesh::HasTangentsAndBitangents(pcMesh);
      if (bVar10) {
        paVar11 = pcMesh->mTangents;
        uVar3 = paVar18->mIndices[uVar16];
        local_f8[uVar21].z = paVar11[uVar3].z;
        paVar11 = paVar11 + uVar3;
        fVar6 = paVar11->y;
        local_f8[uVar21].x = paVar11->x;
        local_f8[uVar21].y = fVar6;
        paVar11 = pcMesh->mBitangents;
        local_108[uVar21].z = paVar11[uVar3].z;
        paVar11 = paVar11 + uVar3;
        fVar6 = paVar11->y;
        local_108[uVar21].x = paVar11->x;
        local_108[uVar21].y = fVar6;
      }
      lVar17 = 0;
      while (((lVar17 != 8 &&
              (paVar11 = pcMesh->mTextureCoords[lVar17], paVar11 != (aiVector3D *)0x0)) &&
             (pcMesh->mNumVertices != 0))) {
        uVar3 = paVar18->mIndices[uVar16];
        paVar4 = apvTextureCoords[lVar17];
        paVar4[uVar21].z = paVar11[uVar3].z;
        fVar6 = paVar11[uVar3].y;
        paVar4 = paVar4 + uVar21;
        paVar4->x = paVar11[uVar3].x;
        paVar4->y = fVar6;
        lVar17 = lVar17 + 1;
      }
      for (lVar17 = 0; lVar17 != 8; lVar17 = lVar17 + 1) {
        puVar14 = paVar18->mIndices;
        if ((pcMesh->mColors[lVar17] == (aiColor4D *)0x0) || (pcMesh->mNumVertices == 0))
        goto LAB_0031ab14;
        paVar12 = pcMesh->mColors[lVar17] + puVar14[uVar16];
        fVar6 = paVar12->g;
        fVar7 = paVar12->b;
        fVar8 = paVar12->a;
        paVar1 = apvColorSets[lVar17] + uVar21;
        paVar1->r = paVar12->r;
        paVar1->g = fVar6;
        paVar1->b = fVar7;
        paVar1->a = fVar8;
      }
      puVar14 = paVar18->mIndices;
LAB_0031ab14:
      puVar14[uVar16] = uVar20;
      uVar21 = (ulong)(uVar20 + 1);
    }
    uVar22 = local_c8 + 1;
  } while( true );
}

Assistant:

bool MakeVerboseFormatProcess::MakeVerboseFormat(aiMesh* pcMesh)
{
    ai_assert(NULL != pcMesh);

    unsigned int iOldNumVertices = pcMesh->mNumVertices;
    const unsigned int iNumVerts = pcMesh->mNumFaces*3;

    aiVector3D* pvPositions = new aiVector3D[ iNumVerts ];

    aiVector3D* pvNormals = NULL;
    if (pcMesh->HasNormals())
    {
        pvNormals = new aiVector3D[iNumVerts];
    }
    aiVector3D* pvTangents = NULL, *pvBitangents = NULL;
    if (pcMesh->HasTangentsAndBitangents())
    {
        pvTangents = new aiVector3D[iNumVerts];
        pvBitangents = new aiVector3D[iNumVerts];
    }

    aiVector3D* apvTextureCoords[AI_MAX_NUMBER_OF_TEXTURECOORDS] = {0};
    aiColor4D* apvColorSets[AI_MAX_NUMBER_OF_COLOR_SETS] = {0};

    unsigned int p = 0;
    while (pcMesh->HasTextureCoords(p))
        apvTextureCoords[p++] = new aiVector3D[iNumVerts];

    p = 0;
    while (pcMesh->HasVertexColors(p))
        apvColorSets[p++] = new aiColor4D[iNumVerts];

    // allocate enough memory to hold output bones and vertex weights ...
    std::vector<aiVertexWeight>* newWeights = new std::vector<aiVertexWeight>[pcMesh->mNumBones];
    for (unsigned int i = 0;i < pcMesh->mNumBones;++i) {
        newWeights[i].reserve(pcMesh->mBones[i]->mNumWeights*3);
    }

    // iterate through all faces and build a clean list
    unsigned int iIndex = 0;
    for (unsigned int a = 0; a< pcMesh->mNumFaces;++a)
    {
        aiFace* pcFace = &pcMesh->mFaces[a];
        for (unsigned int q = 0; q < pcFace->mNumIndices;++q,++iIndex)
        {
            // need to build a clean list of bones, too
            for (unsigned int i = 0;i < pcMesh->mNumBones;++i)
            {
                for (unsigned int a = 0;  a < pcMesh->mBones[i]->mNumWeights;a++)
                {
                    const aiVertexWeight& w = pcMesh->mBones[i]->mWeights[a];
                    if(pcFace->mIndices[q] == w.mVertexId)
                    {
                        aiVertexWeight wNew;
                        wNew.mVertexId = iIndex;
                        wNew.mWeight = w.mWeight;
                        newWeights[i].push_back(wNew);
                    }
                }
            }

            pvPositions[iIndex] = pcMesh->mVertices[pcFace->mIndices[q]];

            if (pcMesh->HasNormals())
            {
                pvNormals[iIndex] = pcMesh->mNormals[pcFace->mIndices[q]];
            }
            if (pcMesh->HasTangentsAndBitangents())
            {
                pvTangents[iIndex] = pcMesh->mTangents[pcFace->mIndices[q]];
                pvBitangents[iIndex] = pcMesh->mBitangents[pcFace->mIndices[q]];
            }

            unsigned int p = 0;
            while (pcMesh->HasTextureCoords(p))
            {
                apvTextureCoords[p][iIndex] = pcMesh->mTextureCoords[p][pcFace->mIndices[q]];
                ++p;
            }
            p = 0;
            while (pcMesh->HasVertexColors(p))
            {
                apvColorSets[p][iIndex] = pcMesh->mColors[p][pcFace->mIndices[q]];
                ++p;
            }
            pcFace->mIndices[q] = iIndex;
        }
    }



    // build output vertex weights
    for (unsigned int i = 0;i < pcMesh->mNumBones;++i)
    {
        delete [] pcMesh->mBones[i]->mWeights;
        if (!newWeights[i].empty()) {
            pcMesh->mBones[i]->mWeights = new aiVertexWeight[newWeights[i].size()];
            aiVertexWeight *weightToCopy = &( newWeights[i][0] );
            memcpy(pcMesh->mBones[i]->mWeights, weightToCopy,
                sizeof(aiVertexWeight) * newWeights[i].size());
        } else {
            pcMesh->mBones[i]->mWeights = NULL;
        }
    }
    delete[] newWeights;

    // delete the old members
    delete[] pcMesh->mVertices;
    pcMesh->mVertices = pvPositions;

    p = 0;
    while (pcMesh->HasTextureCoords(p))
    {
        delete[] pcMesh->mTextureCoords[p];
        pcMesh->mTextureCoords[p] = apvTextureCoords[p];
        ++p;
    }
    p = 0;
    while (pcMesh->HasVertexColors(p))
    {
        delete[] pcMesh->mColors[p];
        pcMesh->mColors[p] = apvColorSets[p];
        ++p;
    }
    pcMesh->mNumVertices = iNumVerts;

    if (pcMesh->HasNormals())
    {
        delete[] pcMesh->mNormals;
        pcMesh->mNormals = pvNormals;
    }
    if (pcMesh->HasTangentsAndBitangents())
    {
        delete[] pcMesh->mTangents;
        pcMesh->mTangents = pvTangents;
        delete[] pcMesh->mBitangents;
        pcMesh->mBitangents = pvBitangents;
    }
    return (pcMesh->mNumVertices != iOldNumVertices);
}